

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall embree::FileStream::~FileStream(FileStream *this)

{
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__FileStream_002a8668;
  if (((&this->field_0x60)[*(long *)(*(long *)&this->ifs + -0x18)] & 5) == 0) {
    std::ifstream::close();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->name).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::ifstream::~ifstream(&this->ifs);
  Stream<int>::~Stream(&this->super_Stream<int>);
  return;
}

Assistant:

~FileStream() { 
      if (ifs) ifs.close();
    }